

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
::clear(Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
        *this,ID_index rowIndex)

{
  iterator it;
  iterator local_58;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  local_50;
  
  local_50.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_50.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_50.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_50.super_Column_hook.super_type.super_type.super_rbtree_node<void_*>.parent_ = (node_ptr)0x0
  ;
  local_50.super_Column_hook.super_type.super_type.super_rbtree_node<void_*>.left_ = (node_ptr)0x0;
  local_50.super_Column_hook.super_type.super_type.super_rbtree_node<void_*>.right_ = (node_ptr)0x0;
  local_50.rowIndex_ = rowIndex;
  boost::intrusive::
  bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_column_tag,3u>,void,void,(boost::intrusive::algo_types)5,void>
  ::
  find<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
            ((bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_column_tag,3u>,void,void,(boost::intrusive::algo_types)5,void>
              *)&local_58,&this->column_);
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  ::~Entry(&local_50);
  if (local_58.members_.nodeptr_ !=
      (iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>_*,_false>
       )&this->column_) {
    _delete_entry(this,&local_58);
  }
  return;
}

Assistant:

inline void Intrusive_set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto it = column_.find(Entry(rowIndex));
  if (it != column_.end()) {
    _delete_entry(it);
  }
}